

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O3

emptyness_t __thiscall
so_5::disp::thread_pool::impl::work_thread_details::
work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
::process_queue(work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
                *this,agent_queue_t *queue)

{
  demand_t *pdVar1;
  pop_result_t pVar2;
  size_t demands_processed;
  
  demands_processed = 1;
  do {
    pdVar1 = (queue->m_head).m_next;
    (*(pdVar1->super_execution_demand_t).m_demand_handler)
              ((current_thread_id_t)*(native_handle_type *)(this + 8),
               &pdVar1->super_execution_demand_t);
    pVar2 = agent_queue_t::pop(queue,demands_processed);
    demands_processed = demands_processed + 1;
  } while (pVar2.m_continuation == enabled);
  return pVar2.m_emptyness;
}

Assistant:

agent_queue_t::emptyness_t
		process_queue( agent_queue_t & queue )
			{
				std::size_t demands_processed = 0;
				agent_queue_t::pop_result_t pop_result;

				do
					{
						auto & d = queue.front();

						this->work_started();

						d.call_handler( this->m_thread_id );

						this->work_finished();

						++demands_processed;
						pop_result = queue.pop( demands_processed );
					}
				while( agent_queue_t::processing_continuation_t::enabled ==
						pop_result.m_continuation );

				return pop_result.m_emptyness;
			}